

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::ExtensionRangeOptions::MergeFrom(ExtensionRangeOptions *this,Message *from)

{
  ExtensionRangeOptions *pEVar1;
  ExtensionRangeOptions *in_RDI;
  ExtensionRangeOptions *unaff_retaddr;
  ExtensionRangeOptions *source;
  Message *in_stack_000003c8;
  Message *in_stack_000003d0;
  
  pEVar1 = DynamicCastToGenerated<google::protobuf::ExtensionRangeOptions>(&in_RDI->super_Message);
  if (pEVar1 == (ExtensionRangeOptions *)0x0) {
    internal::ReflectionOps::Merge(in_stack_000003d0,in_stack_000003c8);
  }
  else {
    MergeFrom(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void ExtensionRangeOptions::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.ExtensionRangeOptions)
  GOOGLE_DCHECK_NE(&from, this);
  const ExtensionRangeOptions* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<ExtensionRangeOptions>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.ExtensionRangeOptions)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.ExtensionRangeOptions)
    MergeFrom(*source);
  }
}